

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O3

Mat * __thiscall Mat::operator+(Mat *__return_storage_ptr__,Mat *this,Mat *a)

{
  ulong *puVar1;
  pointer p_Var2;
  pointer p_Var3;
  pointer p_Var4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  
  Mat(__return_storage_ptr__,this->r,this->c);
  uVar8 = this->c * this->r;
  if (0 < (int)uVar8) {
    p_Var2 = (this->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
             super__Vector_impl_data._M_start;
    p_Var3 = (a->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
             super__Vector_impl_data._M_start;
    p_Var4 = (__return_storage_ptr__->val).super__Vector_base<__int128,_std::allocator<__int128>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar9 = 0;
    do {
      uVar7 = *(ulong *)((long)p_Var3 + lVar9);
      puVar1 = (ulong *)((long)p_Var2 + lVar9);
      uVar10 = uVar7 + *puVar1;
      lVar6 = *(long *)((long)p_Var3 + lVar9 + 8) + *(long *)((long)p_Var2 + lVar9 + 8) +
              (ulong)CARRY8(uVar7,*puVar1);
      uVar7 = uVar10 + 0x16345785d8a0003;
      lVar5 = lVar6 + (ulong)(0xfe9cba87a275fffc < uVar10);
      if ((SBORROW8(lVar6,-1) != SBORROW8(lVar6 + 1,(ulong)(uVar10 < 0xfe9cba87a275fffe))) ==
          (long)((lVar6 + 1) - (ulong)(uVar10 < 0xfe9cba87a275fffe)) < 0) {
        uVar7 = uVar10;
        lVar5 = lVar6;
      }
      if (-lVar6 < (long)(ulong)(0x16345785d8a0002 < uVar10)) {
        uVar7 = uVar10 + 0xfe9cba87a275fffd;
        lVar5 = lVar6 + -1 + (ulong)(0x16345785d8a0002 < uVar10);
      }
      *(ulong *)((long)p_Var4 + lVar9) = uVar7;
      *(long *)((long)p_Var4 + lVar9 + 8) = lVar5;
      lVar9 = lVar9 + 0x10;
    } while ((ulong)uVar8 << 4 != lVar9);
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::operator+(const Mat &a) {
    Mat ret(r, c);
    int l = r * c;
    for (int i = 0; i < l; i++) {
        ret.val[i] = val[i] + a.val[i];
        ret.val[i] = ret.val[i] >= MOD ? ret.val[i] - MOD : ret.val[i];
        ret.val[i] = ret.val[i] <= -MOD ? ret.val[i] + MOD : ret.val[i];
    }
    return ret;
}